

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-test-compare.cc
# Opt level: O2

string * compare_abi_cxx11_(string *__return_storage_ptr__,char *actual_filename,
                           char *expected_filename,char *password)

{
  undefined8 uVar1;
  long lVar2;
  ulong uVar3;
  QPDF expected;
  QPDF actual;
  QPDFObjGen act_og;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> actual_objects;
  long local_120;
  value_type act;
  QPDFObjectHandle exp_trailer;
  QPDFObjectHandle act_trailer;
  string local_e0;
  string trailer_diff;
  value_type exp;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> expected_objects;
  long local_80;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  QPDF::QPDF(&actual);
  QPDF::processFile((char *)&actual,actual_filename);
  QPDF::QPDF(&expected);
  QPDF::processFile((char *)&expected,expected_filename);
  QPDF::getTrailer();
  QPDF::getTrailer();
  cleanTrailer(&act_trailer);
  cleanTrailer(&exp_trailer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"trailer",(allocator<char> *)&actual_objects);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&act_trailer);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&exp_trailer);
  compareObjects(&trailer_diff,&local_e0,(QPDFObjectHandle *)&local_40,(QPDFObjectHandle *)&local_50
                );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__cxx11::string::~string((string *)&local_e0);
  if (trailer_diff._M_string_length == 0) {
    cleanEncryption(&actual);
    cleanEncryption(&expected);
    QPDF::getAllObjects();
    QPDF::getAllObjects();
    if (local_120 - _actual_objects == local_80 - _expected_objects) {
      lVar2 = 0;
      for (uVar3 = 0; uVar3 < (ulong)(local_120 - _actual_objects >> 4); uVar3 = uVar3 + 1) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&act,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(_actual_objects + lVar2)
                  );
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&exp,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                   (_expected_objects + lVar2));
        act_og = (QPDFObjGen)QPDFObjectHandle::getObjGen();
        uVar1 = QPDFObjectHandle::getObjGen();
        if ((act_og.obj != (int)uVar1) || (act_og.gen != (int)((ulong)uVar1 >> 0x20))) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"different object IDs",
                     (allocator<char> *)&local_e0);
LAB_00104377:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&exp.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&act.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          goto LAB_0010438e;
        }
        QPDFObjGen::unparse_abi_cxx11_(&local_e0,&act_og,',');
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&act);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&exp);
        compareObjects(__return_storage_ptr__,&local_e0,(QPDFObjectHandle *)&local_60,
                       (QPDFObjectHandle *)&local_70);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        std::__cxx11::string::~string((string *)&local_e0);
        if (__return_storage_ptr__->_M_string_length != 0) goto LAB_00104377;
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&exp.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&act.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        lVar2 = lVar2 + 0x10;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_e0);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"different number of objects",
                 (allocator<char> *)&local_e0);
    }
LAB_0010438e:
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&expected_objects);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&actual_objects);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)trailer_diff._M_dataplus._M_p == &trailer_diff.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(trailer_diff.field_2._M_allocated_capacity._1_7_,
                    trailer_diff.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = trailer_diff.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = trailer_diff._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(trailer_diff.field_2._M_allocated_capacity._1_7_,
                    trailer_diff.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = trailer_diff._M_string_length;
    trailer_diff._M_string_length = 0;
    trailer_diff.field_2._M_local_buf[0] = '\0';
    trailer_diff._M_dataplus._M_p = (pointer)&trailer_diff.field_2;
  }
  std::__cxx11::string::~string((string *)&trailer_diff);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&exp_trailer.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&act_trailer.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::~QPDF(&expected);
  QPDF::~QPDF(&actual);
  return __return_storage_ptr__;
}

Assistant:

std::string
compare(char const* actual_filename, char const* expected_filename, char const* password)
{
    QPDF actual;
    actual.processFile(actual_filename, password);
    QPDF expected;
    expected.processFile(expected_filename, password);
    // The motivation behind this program is to compare files in a way that allows for
    // differences in the exact bytes of zlib compression. If all zlib implementations produced
    // exactly the same output, we would just be able to use straight comparison, but since they
    // don't, we use this. As such, we are enforcing a standard of "sameness" that goes beyond
    // showing semantic equivalence. The only difference we are allowing is compressed data.

    auto act_trailer = actual.getTrailer();
    auto exp_trailer = expected.getTrailer();
    cleanTrailer(act_trailer);
    cleanTrailer(exp_trailer);
    auto trailer_diff = compareObjects("trailer", act_trailer, exp_trailer);
    if (!trailer_diff.empty()) {
        QTC::TC("compare", "different trailer");
        return trailer_diff;
    }

    cleanEncryption(actual);
    cleanEncryption(expected);

    auto actual_objects = actual.getAllObjects();
    auto expected_objects = expected.getAllObjects();
    if (actual_objects.size() != expected_objects.size()) {
        // Not exercised in the test suite since the trailers will differ in this case.
        return "different number of objects";
    }
    for (size_t i = 0; i < actual_objects.size(); ++i) {
        auto act = actual_objects[i];
        auto exp = expected_objects[i];
        auto act_og = act.getObjGen();
        auto exp_og = exp.getObjGen();
        if (act_og != exp_og) {
            // not reproduced in the test suite
            return "different object IDs";
        }
        auto ret = compareObjects(act_og.unparse(), act, exp);
        if (!ret.empty()) {
            return ret;
        }
    }
    return "";
}